

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

PointerReader *
capnp::_::PointerReader::getRoot
          (PointerReader *__return_storage_ptr__,SegmentReader *segment,CapTableReader *capTable,
          word *location,int nestingLimit)

{
  uint64_t uVar1;
  Fault f;
  Fault local_38;
  
  if (segment == (SegmentReader *)0x0) {
LAB_0014dc4c:
    __return_storage_ptr__->segment = segment;
    __return_storage_ptr__->capTable = capTable;
    __return_storage_ptr__->pointer = (WirePointer *)location;
    __return_storage_ptr__->nestingLimit = nestingLimit;
    return __return_storage_ptr__;
  }
  if (((long)location - (long)(segment->ptr).ptr >> 3) + 1U <= (segment->ptr).size_) {
    uVar1 = segment->readLimiter->limit;
    if (uVar1 != 0) {
      segment->readLimiter->limit = uVar1 - 1;
      goto LAB_0014dc4c;
    }
    (*segment->arena->_vptr_Arena[3])();
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29]>
            (&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xa6c,FAILED,"WireHelpers::boundsCheck(segment, location, POINTER_SIZE_IN_WORDS)",
             "\"Root location out-of-bounds.\"",(char (*) [29])"Root location out-of-bounds.");
  kj::_::Debug::Fault::fatal(&local_38);
}

Assistant:

PointerReader PointerReader::getRoot(SegmentReader* segment, CapTableReader* capTable,
                                     const word* location, int nestingLimit) {
  KJ_REQUIRE(WireHelpers::boundsCheck(segment, location, POINTER_SIZE_IN_WORDS),
             "Root location out-of-bounds.") {
    location = nullptr;
  }

  return PointerReader(segment, capTable,
      reinterpret_cast<const WirePointer*>(location), nestingLimit);
}